

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deque.h
# Opt level: O3

void __thiscall Deque<int,_std::allocator<int>_>::~Deque(Deque<int,_std::allocator<int>_> *this)

{
  DataBlock **ppDVar1;
  
  reset(this);
  ppDVar1 = (this->big_).arr_;
  if (ppDVar1 != (DataBlock **)0x0) {
    operator_delete(ppDVar1);
    (this->big_).arr_ = (DataBlock **)0x0;
  }
  ppDVar1 = (this->small_).arr_;
  if (ppDVar1 != (DataBlock **)0x0) {
    operator_delete(ppDVar1);
    (this->small_).arr_ = (DataBlock **)0x0;
  }
  ppDVar1 = (this->current_).arr_;
  if (ppDVar1 != (DataBlock **)0x0) {
    operator_delete(ppDVar1);
    (this->current_).arr_ = (DataBlock **)0x0;
  }
  return;
}

Assistant:

~Deque() {
        reset();
    }